

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int ConversionFile(path *source,path *destination,bool use_second_side)

{
  FormatType *pFVar1;
  bool bVar2;
  int iVar3;
  undefined8 uVar4;
  char *pcVar5;
  size_t sVar6;
  undefined4 extraout_var;
  string local_148;
  int local_124;
  IDisk *pIStack_120;
  FaceSelection pSide;
  IDisk *new_disk_side_2;
  IDisk *local_f8;
  IDisk *new_disk;
  string local_e8;
  FormatType *local_c8;
  FormatType *format;
  path local_a0;
  int local_4c;
  undefined1 local_48 [4];
  int return_value;
  DiskBuilder disk_builder;
  bool use_second_side_local;
  path *destination_local;
  path *source_local;
  
  disk_builder.format_list_.super__Vector_base<FormatType_*,_std::allocator<FormatType_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = use_second_side;
  DiskBuilder::DiskBuilder((DiskBuilder *)local_48);
  local_4c = 0;
  bVar2 = std::experimental::filesystem::v1::__cxx11::path::empty(destination);
  if (bVar2) {
    std::experimental::filesystem::v1::__cxx11::path::operator=(destination,source);
    std::experimental::filesystem::v1::__cxx11::path::
    path<char[1],std::experimental::filesystem::v1::__cxx11::path>(&local_a0,(char (*) [1])0x1fcac6)
    ;
    std::experimental::filesystem::v1::__cxx11::path::replace_extension(destination,&local_a0);
    std::experimental::filesystem::v1::__cxx11::path::~path(&local_a0);
  }
  std::experimental::filesystem::v1::__cxx11::path::generic_string((string *)&format,source);
  uVar4 = std::__cxx11::string::c_str();
  printf("Loading %s",uVar4);
  std::__cxx11::string::~string((string *)&format);
  std::experimental::filesystem::v1::__cxx11::path::string(&local_e8,source);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  bVar2 = DiskBuilder::CanLoad((DiskBuilder *)local_48,pcVar5,&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    local_f8 = (IDisk *)0x0;
    std::experimental::filesystem::v1::__cxx11::path::string((string *)&new_disk_side_2,source);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    iVar3 = DiskBuilder::LoadDisk((DiskBuilder *)local_48,pcVar5,&local_f8,(ILoadingProgress *)0x0);
    std::__cxx11::string::~string((string *)&new_disk_side_2);
    if (iVar3 == 0) {
      printf(" ok - ");
      pIStack_120 = (IDisk *)0x0;
      if (((disk_builder.format_list_.
            super__Vector_base<FormatType_*,_std::allocator<FormatType_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) &&
         (sVar6 = strlen(second_side), sVar6 != 0)) {
        bVar2 = DiskBuilder::CanLoad((DiskBuilder *)local_48,second_side,&local_c8);
        if (!bVar2) {
          printf(" !! Error loading disk 2 : Format unknown !!\n");
          source_local._4_4_ = -1;
          goto LAB_0017c03e;
        }
        iVar3 = DiskBuilder::LoadDisk
                          ((DiskBuilder *)local_48,second_side,&stack0xfffffffffffffee0,
                           (ILoadingProgress *)0x0);
        if (iVar3 != 0) {
          printf(" !! Error loading disk 2 !!\n");
          source_local._4_4_ = -1;
          goto LAB_0017c03e;
        }
        printf(" ok - ");
      }
      iVar3 = (**local_c8->_vptr_FormatType)();
      iVar3 = strcmp((char *)CONCAT44(extraout_var,iVar3),"KRYOFLUX");
      if (iVar3 == 0) {
        local_4c = 1;
      }
      local_124 = (*local_f8->_vptr_IDisk[2])(local_f8,(ulong)face_to_convert);
      if (local_124 == 1) {
        printf("Side 0 is kept - ");
      }
      else if (local_124 == 2) {
        printf("Side 1 is kept - ");
      }
      else {
        if (local_124 != 3) {
          printf(" !! Error selecting side\n");
          source_local._4_4_ = -1;
          goto LAB_0017c03e;
        }
        printf("Both Sides are kept - ");
      }
      if ((pIStack_120 != (IDisk *)0x0) &&
         ((*local_f8->_vptr_IDisk[7])(local_f8,pIStack_120), pIStack_120 != (IDisk *)0x0)) {
        (*pIStack_120->_vptr_IDisk[1])();
      }
      pFVar1 = out_support;
      std::experimental::filesystem::v1::__cxx11::path::string(&local_148,destination);
      uVar4 = std::__cxx11::string::c_str();
      (*pFVar1->_vptr_FormatType[9])(pFVar1,uVar4,local_f8,0);
      std::__cxx11::string::~string((string *)&local_148);
      pcVar5 = IDisk::GetCurrentLoadedDisk(local_f8);
      printf("Saving %s \n",pcVar5);
      source_local._4_4_ = local_4c;
    }
    else {
      printf(" !! Error loading disk !!\n");
      source_local._4_4_ = -1;
    }
  }
  else {
    printf(" !! Error loading disk : Format unknown !!\n");
    source_local._4_4_ = -1;
  }
LAB_0017c03e:
  new_disk._4_4_ = 1;
  DiskBuilder::~DiskBuilder((DiskBuilder *)local_48);
  return source_local._4_4_;
}

Assistant:

int ConversionFile(fs::path& source, fs::path& destination, bool use_second_side)
{
   DiskBuilder disk_builder;
   int return_value = 0;

   ////////////////////////////////////
   // Destination
   if (destination.empty())
   {
      // take source, remove file spec
      destination = source;
      destination.replace_extension("");
   }

   printf("Loading %s", source.generic_string().c_str());

   FormatType* format;
   if (!disk_builder.CanLoad(source.string().c_str(), format) )
   {
      printf(" !! Error loading disk : Format unknown !!\n");
      return -1;
   }

   // Load the disk - todo : add progression 
   IDisk* new_disk = nullptr;
   if (disk_builder.LoadDisk(source.string().c_str(), new_disk, nullptr) != 0)
   {
      printf(" !! Error loading disk !!\n");
      return -1;
   }
   else
   {
      printf(" ok - ");
   }

   // Second side foring ?
   IDisk* new_disk_side_2 = nullptr;
   if (use_second_side && strlen(second_side) > 0)
   {
      if (!disk_builder.CanLoad(second_side, format))
      {
         printf(" !! Error loading disk 2 : Format unknown !!\n");
         return -1;
      }

      // Load the disk - todo : add progression 
      if (disk_builder.LoadDisk(second_side, new_disk_side_2, nullptr) != 0)
      {
         printf(" !! Error loading disk 2 !!\n");
         return -1;
      }
      else
      {
         printf(" ok - ");
      }
   }

   // raw ?
   if (strcmp(format->GetFormatName(), "KRYOFLUX") == 0)
   {
      return_value = 1;
   }

   // Filter side
   IDisk::FaceSelection pSide = new_disk->FilterSide(face_to_convert);
   switch (pSide)
   {
   case IDisk::FaceSelection::FACE_1: printf("Side 0 is kept - ");
      break;
   case IDisk::FaceSelection::FACE_2: printf("Side 1 is kept - ");
      break;
   case IDisk::FaceSelection::FACE_BOTH: printf("Both Sides are kept - ");
      break;
   default:
      printf(" !! Error selecting side\n");
      return -1;
   }

   // Combine the 2 dumps, if necessary
   if (new_disk_side_2 != nullptr)
   {
      // Combine both disk      
      new_disk->CombineWithDisk(new_disk_side_2);
      delete new_disk_side_2;
   }


   // Save with the correct format
   out_support->SaveDisk(destination.string().c_str(), new_disk);
   printf("Saving %s \n", new_disk->GetCurrentLoadedDisk());

   return return_value;
}